

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# computer.cpp
# Opt level: O0

float indk::Computer::doCompareCPFunctionD
                (vector<indk::Position_*,_std::allocator<indk::Position_*>_> *CP,
                vector<indk::Position_*,_std::allocator<indk::Position_*>_> *CPf)

{
  Position *L_00;
  size_type sVar1;
  reference ppPVar2;
  float fVar3;
  undefined4 local_2c;
  size_type sStack_28;
  int i;
  int64_t L;
  float R;
  vector<indk::Position_*,_std::allocator<indk::Position_*>_> *CPf_local;
  vector<indk::Position_*,_std::allocator<indk::Position_*>_> *CP_local;
  
  L._4_4_ = 0.0;
  sStack_28 = std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::size(CP);
  sVar1 = std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::size(CPf);
  if (sVar1 < sStack_28) {
    sStack_28 = std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::size(CPf);
  }
  for (local_2c = 0; (long)local_2c < (long)sStack_28; local_2c = local_2c + 1) {
    ppPVar2 = std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::operator[]
                        (CP,(long)local_2c);
    L_00 = *ppPVar2;
    ppPVar2 = std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::operator[]
                        (CPf,(long)local_2c);
    fVar3 = Position::getDistance(L_00,*ppPVar2);
    L._4_4_ = fVar3 + L._4_4_;
  }
  return L._4_4_;
}

Assistant:

float indk::Computer::doCompareCPFunctionD(std::vector<indk::Position*> CP, std::vector<indk::Position*> CPf) {
    float R = 0;
    int64_t L = CP.size();
    if (CPf.size() < L) L = CPf.size();
    for (int i = 0; i < L; i++) R += indk::Position::getDistance(CP[i], CPf[i]);
    return R;
}